

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,EmptyExpressions *ptr)

{
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"empty",&local_21);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void gv_visitor::visit(EmptyExpressions* ptr) {
    box(ptr, "empty");
    //nochildren
}